

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSensorType::IfcSensorType(IfcSensorType *this)

{
  *(undefined ***)&this->field_0x1d0 = &PTR__Object_008ee2a0;
  *(undefined8 *)&this->field_0x1d8 = 0;
  *(char **)&this->field_0x1e0 = "IfcSensorType";
  IfcDistributionControlElementType::IfcDistributionControlElementType
            (&this->super_IfcDistributionControlElementType,&PTR_construction_vtable_24__00968738);
  *(undefined8 *)&(this->super_IfcDistributionControlElementType).field_0x1a8 = 0;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0x9685e0;
  *(undefined8 *)&this->field_0x1d0 = 0x968720;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = 0x968608;
  (this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x968630;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = 0x968658;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.field_0x148 = 0x968680;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x180 = 0x9686a8;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x190 = 0x9686d0;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.field_0x1a0 =
       0x9686f8;
  *(undefined1 **)&(this->super_IfcDistributionControlElementType).field_0x1b0 = &this->field_0x1c0;
  *(undefined8 *)&this->field_0x1b8 = 0;
  this->field_0x1c0 = 0;
  return;
}

Assistant:

IfcSensorType() : Object("IfcSensorType") {}